

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

_Bool sesschan_send_break(Channel *chan,uint length)

{
  bool bVar1;
  sesschan *sess;
  uint length_local;
  Channel *chan_local;
  
  bVar1 = *(long *)&chan[-5].initial_fixed_window_size != 0;
  if (bVar1) {
    backend_special(*(Backend **)&chan[-5].initial_fixed_window_size,SS_BRK,0);
  }
  return bVar1;
}

Assistant:

bool sesschan_send_break(Channel *chan, unsigned length)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    if (sess->backend) {
        /* We ignore the break length. We could pass it through as the
         * 'arg' parameter, and have pty.c collect it and pass it on
         * to tcsendbreak, but since tcsendbreak in turn assigns
         * implementation-defined semantics to _its_ duration
         * parameter, this all just sounds too difficult. */
        backend_special(sess->backend, SS_BRK, 0);
        return true;
    }
    return false;
}